

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_time.c
# Opt level: O3

timeval * zt_sub_time(timeval *st,timeval *t1,timeval *t2)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  lVar4 = t1->tv_sec - t2->tv_sec;
  st->tv_sec = lVar4;
  lVar1 = t1->tv_usec;
  lVar2 = t2->tv_usec;
  uVar6 = lVar1 - lVar2;
  if ((long)uVar6 < 0) {
    uVar3 = 0xfffffffffff0bdc0;
    if (0xfffffffffff0bdc0 < uVar6) {
      uVar3 = uVar6;
    }
    uVar5 = (ulong)(uVar3 + lVar2 != lVar1);
    uVar5 = (((uVar3 + lVar2) - lVar1) - uVar5) / 1000000 + uVar5;
    uVar6 = ((uVar5 * 1000000 + lVar1) - lVar2) + 1000000;
    st->tv_sec = lVar4 + ~uVar5;
  }
  st->tv_usec = uVar6;
  return st;
}

Assistant:

struct timeval *
zt_sub_time(struct timeval *st, struct timeval *t1, struct timeval *t2)
{
    st->tv_sec = t1->tv_sec - t2->tv_sec;
    st->tv_usec = t1->tv_usec - t2->tv_usec;

    while (st->tv_usec < 0) {
        st->tv_sec--;
        st->tv_usec += 1000000;
    }

    return st;
}